

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

shared_ptr<Quest_Context> __thiscall Character::GetQuest(Character *this,short id)

{
  long lVar1;
  short sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined6 in_register_00000032;
  long lVar4;
  long lVar5;
  shared_ptr<Quest_Context> sVar6;
  shared_ptr<Quest_Context> sVar7;
  shared_ptr<Quest_Context> sVar8;
  
  lVar5 = *(long *)(CONCAT62(in_register_00000032,id) + 0x3a0);
  if (lVar5 != 0) {
    lVar4 = CONCAT62(in_register_00000032,id) + 0x398;
    lVar1 = lVar4;
    do {
      sVar2 = (short)in_RDX._M_pi;
      if (sVar2 <= *(short *)(lVar5 + 0x20)) {
        lVar1 = lVar5;
      }
      lVar5 = *(long *)(lVar5 + 0x10 + (ulong)(*(short *)(lVar5 + 0x20) < sVar2) * 8);
    } while (lVar5 != 0);
    if ((lVar1 != lVar4) && (*(short *)(lVar1 + 0x20) <= sVar2)) {
      _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x28);
      (this->super_Command_Source)._vptr_Command_Source = (_func_int **)_Var3._M_pi;
      lVar5 = *(long *)(lVar1 + 0x30);
      this->login_time = (int)lVar5;
      this->online = (bool)(char)((ulong)lVar5 >> 0x20);
      this->nowhere = (bool)(char)((ulong)lVar5 >> 0x28);
      *(short *)&this->field_0xe = (short)((ulong)lVar5 >> 0x30);
      if (lVar5 != 0) {
        _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        if (__libc_single_threaded != '\0') {
          *(int *)(lVar5 + 8) = *(int *)(lVar5 + 8) + 1;
          sVar7.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          sVar7.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)this;
          return (shared_ptr<Quest_Context>)
                 sVar7.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
        }
        LOCK();
        *(int *)(lVar5 + 8) = *(int *)(lVar5 + 8) + 1;
        UNLOCK();
      }
      sVar8.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      sVar8.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<Quest_Context>)
             sVar8.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  (this->super_Command_Source)._vptr_Command_Source = (_func_int **)0x0;
  this->login_time = 0;
  this->online = false;
  this->nowhere = false;
  *(undefined2 *)&this->field_0xe = 0;
  sVar6.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar6.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Quest_Context>)
         sVar6.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Quest_Context> Character::GetQuest(short id)
{
	auto it = this->quests.find(id);

	if (it == this->quests.end())
		return std::shared_ptr<Quest_Context>();

	return it->second;
}